

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O2

list<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
StackTrace::make_trace_abi_cxx11_
          (list<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          StackTrace *this,pair<unsigned_long,_unsigned_long> *data)

{
  unsigned_long uVar1;
  
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node._M_size = 0;
  uVar1 = data->second;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_front
            (__return_storage_ptr__,&data->first);
  for (; uVar1 != this->_root;
      uVar1 = **(unsigned_long **)
                &(this->_local_stack).super_type.m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar1].super_StoredVertex.m_out_edges.
                 super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
      ) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_front
              (__return_storage_ptr__,
               &(this->_local_stack).super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar1].super_StoredVertex.m_property.addr)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<size_t> StackTrace::make_trace(
    const std::pair<size_t, StackTree::vertex_descriptor>& data) const {
  std::list<size_t> this_stack;

  StackTree::vertex_descriptor act_item = data.second;

  this_stack.push_front(data.first);
  while ((act_item != _root)) {
    this_stack.push_front(_local_stack[act_item].addr);
    // we are not root, hence we have edges per-definition
    const auto edge = boost::out_edges(act_item, _local_stack);
    act_item = boost::target(*(edge.first), _local_stack);
  }

  return this_stack;
}